

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charstr.cpp
# Opt level: O0

CharString * __thiscall
icu_63::CharString::append(CharString *this,char *s,int32_t sLength,UErrorCode *errorCode)

{
  UBool UVar1;
  int32_t iVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  CharString local_70;
  UErrorCode *local_30;
  UErrorCode *errorCode_local;
  char *pcStack_20;
  int32_t sLength_local;
  char *s_local;
  CharString *this_local;
  
  local_30 = errorCode;
  errorCode_local._4_4_ = sLength;
  pcStack_20 = s;
  s_local = (char *)this;
  UVar1 = ::U_FAILURE(*errorCode);
  this_local = this;
  if (UVar1 == '\0') {
    if ((errorCode_local._4_4_ < -1) ||
       ((pcStack_20 == (char *)0x0 && (errorCode_local._4_4_ != 0)))) {
      *local_30 = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      if (errorCode_local._4_4_ < 0) {
        sVar4 = strlen(pcStack_20);
        errorCode_local._4_4_ = (int32_t)sVar4;
      }
      pcVar6 = pcStack_20;
      if (0 < errorCode_local._4_4_) {
        pcVar5 = MaybeStackArray<char,_40>::getAlias(&this->buffer);
        iVar3 = errorCode_local._4_4_;
        if (pcVar6 == pcVar5 + this->len) {
          iVar2 = MaybeStackArray<char,_40>::getCapacity(&this->buffer);
          if (iVar3 < iVar2 - this->len) {
            iVar3 = errorCode_local._4_4_ + this->len;
            this->len = iVar3;
            pcVar6 = MaybeStackArray<char,_40>::operator[](&this->buffer,(long)iVar3);
            *pcVar6 = '\0';
          }
          else {
            *local_30 = U_INTERNAL_PROGRAM_ERROR;
          }
        }
        else {
          pcVar5 = MaybeStackArray<char,_40>::getAlias(&this->buffer);
          pcVar6 = pcStack_20;
          if (((pcStack_20 < pcVar5) ||
              (pcVar5 = MaybeStackArray<char,_40>::getAlias(&this->buffer),
              iVar3 = errorCode_local._4_4_, pcVar5 + this->len <= pcVar6)) ||
             (iVar2 = MaybeStackArray<char,_40>::getCapacity(&this->buffer),
             iVar3 < iVar2 - this->len)) {
            UVar1 = ensureCapacity(this,this->len + errorCode_local._4_4_ + 1,0,local_30);
            if (UVar1 != '\0') {
              pcVar6 = MaybeStackArray<char,_40>::getAlias(&this->buffer);
              memcpy(pcVar6 + this->len,pcStack_20,(long)errorCode_local._4_4_);
              iVar3 = errorCode_local._4_4_ + this->len;
              this->len = iVar3;
              pcVar6 = MaybeStackArray<char,_40>::operator[](&this->buffer,(long)iVar3);
              *pcVar6 = '\0';
            }
          }
          else {
            CharString(&local_70,pcStack_20,errorCode_local._4_4_,local_30);
            this_local = append(this,&local_70,local_30);
            ~CharString(&local_70);
          }
        }
      }
    }
  }
  return this_local;
}

Assistant:

CharString &CharString::append(const char *s, int32_t sLength, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return *this;
    }
    if(sLength<-1 || (s==NULL && sLength!=0)) {
        errorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return *this;
    }
    if(sLength<0) {
        sLength= static_cast<int32_t>(uprv_strlen(s));
    }
    if(sLength>0) {
        if(s==(buffer.getAlias()+len)) {
            // The caller wrote into the getAppendBuffer().
            if(sLength>=(buffer.getCapacity()-len)) {
                // The caller wrote too much.
                errorCode=U_INTERNAL_PROGRAM_ERROR;
            } else {
                buffer[len+=sLength]=0;
            }
        } else if(buffer.getAlias()<=s && s<(buffer.getAlias()+len) &&
                  sLength>=(buffer.getCapacity()-len)
        ) {
            // (Part of) this string is appended to itself which requires reallocation,
            // so we have to make a copy of the substring and append that.
            return append(CharString(s, sLength, errorCode), errorCode);
        } else if(ensureCapacity(len+sLength+1, 0, errorCode)) {
            uprv_memcpy(buffer.getAlias()+len, s, sLength);
            buffer[len+=sLength]=0;
        }
    }
    return *this;
}